

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istream_range.hpp
# Opt level: O2

iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_> *
burst::make_istream_range<int>
          (iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>
           *__return_storage_ptr__,istream *s)

{
  istream_iterator<int,_char,_std::char_traits<char>,_long> local_20;
  
  std::istream_iterator<int,_char,_std::char_traits<char>,_long>::istream_iterator(&local_20,s);
  (__return_storage_ptr__->
  super_iterator_range_base<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_boost::iterators::incrementable_traversal_tag>
  ).m_Begin._M_stream = local_20._M_stream;
  (__return_storage_ptr__->
  super_iterator_range_base<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_boost::iterators::incrementable_traversal_tag>
  ).m_Begin._M_value = local_20._M_value;
  (__return_storage_ptr__->
  super_iterator_range_base<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_boost::iterators::incrementable_traversal_tag>
  ).m_Begin._M_ok = local_20._M_ok;
  (__return_storage_ptr__->
  super_iterator_range_base<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_boost::iterators::incrementable_traversal_tag>
  ).m_End._M_stream = (istream_type *)0x0;
  (__return_storage_ptr__->
  super_iterator_range_base<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_boost::iterators::incrementable_traversal_tag>
  ).m_End._M_value = 0;
  (__return_storage_ptr__->
  super_iterator_range_base<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_boost::iterators::incrementable_traversal_tag>
  ).m_End._M_ok = false;
  return __return_storage_ptr__;
}

Assistant:

auto make_istream_range (std::istream & s)
    {
        return boost::make_iterator_range(std::istream_iterator<T>(s), std::istream_iterator<T>{});
    }